

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnTableFill(SharedValidator *this,Location *loc,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  TableType table_type;
  TableType local_88;
  Var local_68;
  
  this->expr_loc_ = loc;
  local_88.element.enum_ = Any;
  local_88.limits.initial = 0;
  local_88.limits.max._0_7_ = 0;
  local_88.limits._15_4_ = 0;
  Var::Var(&local_68,table_var);
  RVar1 = CheckTableIndex(this,&local_68,&local_88);
  Var::~Var(&local_68);
  RVar2 = TypeChecker::OnTableFill(&this->typechecker_,local_88.element);
  RVar1.enum_._0_1_ = RVar2.enum_ == Error || RVar1.enum_ == Error;
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnTableFill(const Location& loc, Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType table_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= typechecker_.OnTableFill(table_type.element);
  return result;
}